

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O3

SQChar * __thiscall SQSharedState::GetScratchPad(SQSharedState *this,SQInteger size)

{
  ulong oldsize;
  SQChar *pSVar1;
  SQUnsignedInteger size_00;
  
  if (0 < size) {
    oldsize = this->_scratchpadsize;
    if ((long)oldsize < size) {
      size_00 = ((ulong)size >> 1) + size;
    }
    else {
      if ((long)oldsize < size * 0x20) goto LAB_0012045c;
      size_00 = oldsize >> 1;
    }
    pSVar1 = (SQChar *)sq_vm_realloc(this->_scratchpad,oldsize,size_00);
    this->_scratchpad = pSVar1;
    this->_scratchpadsize = size_00;
  }
LAB_0012045c:
  return this->_scratchpad;
}

Assistant:

SQChar* SQSharedState::GetScratchPad(SQInteger size)
{
    SQInteger newsize;
    if(size>0) {
        if(_scratchpadsize < size) {
            newsize = size + (size>>1);
            _scratchpad = (SQChar *)SQ_REALLOC(_scratchpad,_scratchpadsize,newsize);
            _scratchpadsize = newsize;

        }else if(_scratchpadsize >= (size<<5)) {
            newsize = _scratchpadsize >> 1;
            _scratchpad = (SQChar *)SQ_REALLOC(_scratchpad,_scratchpadsize,newsize);
            _scratchpadsize = newsize;
        }
    }
    return _scratchpad;
}